

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZPersistenceManager.cpp
# Opt level: O0

TPZAutoPointer<TPZSavable> TPZPersistenceManager::GetAutoPointer(int64_t *objId)

{
  bool bVar1;
  TPZRestoredInstance *pTVar2;
  TPZSavable *pTVar3;
  TPZChunkInTranslation *pTVar4;
  TPZAutoPointer<TPZChunkInTranslation> *this;
  size_t sVar5;
  long *in_RSI;
  TPZReference *in_RDI;
  TPZAutoPointer<TPZSavable> autoPointer;
  size_t in_stack_00000388;
  char *in_stack_00000390;
  TPZRestoredInstance *in_stack_ffffffffffffff70;
  TPZAutoPointer<TPZSavable> *in_stack_ffffffffffffff80;
  TPZRestoredInstance *in_stack_ffffffffffffff98;
  TPZAutoPointer<TPZSavable> local_18;
  long *local_10;
  
  local_10 = in_RSI;
  TPZAutoPointer<TPZSavable>::TPZAutoPointer(in_stack_ffffffffffffff80);
  if (*local_10 == -1) {
    TPZAutoPointer<TPZSavable>::TPZAutoPointer((TPZAutoPointer<TPZSavable> *)in_RDI,&local_18);
  }
  else {
    pTVar2 = TPZVec<TPZRestoredInstance>::operator[](&mObjVec,*local_10);
    bVar1 = TPZRestoredInstance::IsAlreadyRead(pTVar2);
    if (!bVar1) {
      pTVar2 = TPZVec<TPZRestoredInstance>::operator[](&mObjVec,*local_10);
      TPZRestoredInstance::SetRead(pTVar2);
      pTVar2 = TPZVec<TPZRestoredInstance>::operator[](&mObjVec,*local_10);
      pTVar3 = TPZRestoredInstance::GetPointerToMyObj(pTVar2);
      in_stack_ffffffffffffff98 =
           (TPZRestoredInstance *)
           TPZVec<TPZAutoPointer<TPZChunkInTranslation>_>::operator[](&mChunksVec,*local_10);
      pTVar4 = TPZAutoPointer<TPZChunkInTranslation>::operator->
                         ((TPZAutoPointer<TPZChunkInTranslation> *)in_stack_ffffffffffffff98);
      (*pTVar3->_vptr_TPZSavable[6])(pTVar3,&pTVar4->mNewStream,0);
      this = TPZVec<TPZAutoPointer<TPZChunkInTranslation>_>::operator[](&mChunksVec,*local_10);
      pTVar4 = TPZAutoPointer<TPZChunkInTranslation>::operator->(this);
      sVar5 = TPZContBufferedStream::Size(&pTVar4->mNewStream);
      if (sVar5 != 0) {
        pzinternal::DebugStopImpl(in_stack_00000390,in_stack_00000388);
      }
    }
    in_stack_ffffffffffffff70 = TPZVec<TPZRestoredInstance>::operator[](&mObjVec,*local_10);
    TPZRestoredInstance::GetAutoPointerToMyObj(in_stack_ffffffffffffff98);
  }
  TPZAutoPointer<TPZSavable>::~TPZAutoPointer
            ((TPZAutoPointer<TPZSavable> *)in_stack_ffffffffffffff70);
  return (TPZAutoPointer<TPZSavable>)in_RDI;
}

Assistant:

TPZAutoPointer<TPZSavable> TPZPersistenceManager::GetAutoPointer(const int64_t &objId) {
    TPZAutoPointer<TPZSavable> autoPointer;
    if (objId != -1) {
        if (!mObjVec[objId].IsAlreadyRead()) {
            mObjVec[objId].SetRead();
            mObjVec[objId].GetPointerToMyObj()->Read(mChunksVec[objId]->mNewStream, NULL);
            if (mChunksVec[objId]->mNewStream.Size() != 0) {
                DebugStop();
            }
        }
        return mObjVec[objId].GetAutoPointerToMyObj();
    }
    return autoPointer;
}